

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inference.h
# Opt level: O3

void __thiscall
xLearn::Predictor::Initialize
          (Predictor *this,Reader *reader,Model *model,Loss *loss,string *out,bool sign,bool sigmoid
          ,bool res_out)

{
  ostream *poVar1;
  Logger local_6c;
  string local_68;
  string local_48;
  
  if (reader == (Reader *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    local_6c.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
               ,"");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Initialize","");
    poVar1 = Logger::Start(ERR,&local_48,0x34,&local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
               ,0x5f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x34);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"reader",6);
    std::operator<<(poVar1," == NULL \n");
  }
  else if (model == (Model *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    local_6c.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
               ,"");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Initialize","");
    poVar1 = Logger::Start(ERR,&local_48,0x35,&local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
               ,0x5f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"model",5);
    std::operator<<(poVar1," == NULL \n");
  }
  else if (loss == (Loss *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    local_6c.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
               ,"");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Initialize","");
    poVar1 = Logger::Start(ERR,&local_48,0x36,&local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
               ,0x5f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x36);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"loss",4);
    std::operator<<(poVar1," == NULL \n");
  }
  else {
    if ((!res_out) || (out->_M_string_length != 0)) {
      this->reader_ = reader;
      this->model_ = model;
      this->loss_ = loss;
      std::__cxx11::string::_M_assign((string *)&this->out_file_);
      this->sign_ = sign;
      this->sigmoid_ = sigmoid;
      this->res_out_ = res_out;
      return;
    }
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    local_6c.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
               ,"");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Initialize","");
    poVar1 = Logger::Start(ERR,&local_48,0x38,&local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK_NE failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
               ,0x5f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"out.empty()",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"true",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::operator<<(poVar1,"\n");
  }
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  Logger::~Logger(&local_6c);
  abort();
}

Assistant:

void Initialize(Reader* reader,
                  Model* model,
                  Loss* loss,
                  const std::string& out,
                  bool sign = false,
                  bool sigmoid = false,
                  bool res_out = true) {
    CHECK_NOTNULL(reader);
    CHECK_NOTNULL(model);
    CHECK_NOTNULL(loss);
    if (res_out)
      CHECK_NE(out.empty(), true);
    reader_ = reader;
    model_ = model;
    loss_ = loss;
    out_file_ = out;
    sign_ = sign;
    sigmoid_ = sigmoid;
    res_out_ = res_out;
  }